

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall ncnn::Requantize::load_model(Requantize *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_298;
  int *local_290;
  long *local_278;
  void *local_250;
  int *local_248;
  undefined8 local_240;
  undefined4 local_238;
  long *local_230;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined8 local_210;
  void *local_1f8;
  int *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  long *local_1d8;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined8 local_1b8;
  long *local_1b0;
  int local_19c;
  void **local_198;
  void **local_188;
  void **local_178;
  int local_168;
  undefined4 local_164;
  void **local_160;
  void **local_158;
  void **local_150;
  int local_148;
  undefined4 local_144;
  void **local_140;
  void **local_138;
  void **local_130;
  int local_128;
  undefined4 local_124;
  void **local_120;
  void **local_118;
  void **local_110;
  long *local_100;
  long *local_f8;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  void *local_30;
  void *local_28;
  void *local_20;
  long *local_18;
  long *local_10;
  
  local_1b0 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_1f8,in_RSI,*(undefined4 *)(in_RDI + 0xd0),1);
  ppvVar2 = (void **)(in_RDI + 0x128);
  local_120 = &local_1f8;
  local_118 = ppvVar2;
  if (ppvVar2 != local_120) {
    if (local_1f0 != (int *)0x0) {
      local_124 = 1;
      LOCK();
      local_128 = *local_1f0;
      *local_1f0 = *local_1f0 + 1;
      UNLOCK();
    }
    local_e8 = ppvVar2;
    if (*(long *)(in_RDI + 0x130) != 0) {
      piVar1 = *(int **)(in_RDI + 0x130);
      local_ec = 0xffffffff;
      LOCK();
      local_f0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_f0 == 1) {
        if (*(long *)(in_RDI + 0x148) == 0) {
          local_20 = *ppvVar2;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))(*(long **)(in_RDI + 0x148),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *(undefined4 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined4 *)(in_RDI + 0x154) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined8 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *ppvVar2 = *local_120;
    *(void **)(in_RDI + 0x130) = local_120[1];
    *(void **)(in_RDI + 0x138) = local_120[2];
    *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_120 + 3);
    *(void **)(in_RDI + 0x148) = local_120[4];
    *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_120 + 5);
    *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_120 + 0x2c);
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_120 + 6);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_120 + 0x34);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_120 + 7);
    *(void **)(in_RDI + 0x168) = local_120[8];
  }
  local_198 = &local_1f8;
  local_110 = ppvVar2;
  local_68 = local_198;
  if (local_1f0 != (int *)0x0) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_1f0;
    *local_1f0 = *local_1f0 + -1;
    UNLOCK();
    if (local_70 == 1) {
      if (local_1d8 == (long *)0x0) {
        if (local_1f8 != (void *)0x0) {
          free(local_1f8);
        }
      }
      else {
        (**(code **)(*local_1d8 + 0x18))(local_1d8,local_1f8);
      }
    }
  }
  local_1f8 = (void *)0x0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1d0 = 0;
  local_1cc = 0;
  local_1c8 = 0;
  local_1c4 = 0;
  local_1c0 = 0;
  local_1b8 = 0;
  local_1f0 = (int *)0x0;
  local_f8 = (long *)(in_RDI + 0x128);
  bVar3 = true;
  if (*local_f8 != 0) {
    bVar3 = *(long *)(in_RDI + 0x168) * (long)*(int *)(in_RDI + 0x160) == 0;
    local_18 = local_f8;
  }
  if (bVar3) {
    local_19c = -100;
  }
  else {
    (**(code **)(*local_1b0 + 0x10))(&local_250,local_1b0,*(undefined4 *)(in_RDI + 0xd4),1);
    ppvVar2 = (void **)(in_RDI + 0x170);
    local_140 = &local_250;
    local_138 = ppvVar2;
    if (ppvVar2 != local_140) {
      if (local_248 != (int *)0x0) {
        local_144 = 1;
        LOCK();
        local_148 = *local_248;
        *local_248 = *local_248 + 1;
        UNLOCK();
      }
      local_d8 = ppvVar2;
      if (*(long *)(in_RDI + 0x178) != 0) {
        piVar1 = *(int **)(in_RDI + 0x178);
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_e0 == 1) {
          if (*(long *)(in_RDI + 400) == 0) {
            local_28 = *ppvVar2;
            if (local_28 != (void *)0x0) {
              free(local_28);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
      *(undefined4 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x1b0) = 0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *ppvVar2 = *local_140;
      *(void **)(in_RDI + 0x178) = local_140[1];
      *(void **)(in_RDI + 0x180) = local_140[2];
      *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_140 + 3);
      *(void **)(in_RDI + 400) = local_140[4];
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_140 + 5);
      *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_140 + 0x2c);
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_140 + 6);
      *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_140 + 0x34);
      *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_140 + 7);
      *(void **)(in_RDI + 0x1b0) = local_140[8];
    }
    local_188 = &local_250;
    local_130 = ppvVar2;
    local_88 = local_188;
    if (local_248 != (int *)0x0) {
      local_8c = 0xffffffff;
      LOCK();
      local_90 = *local_248;
      *local_248 = *local_248 + -1;
      UNLOCK();
      if (local_90 == 1) {
        if (local_230 == (long *)0x0) {
          if (local_250 != (void *)0x0) {
            free(local_250);
          }
        }
        else {
          (**(code **)(*local_230 + 0x18))(local_230,local_250);
        }
      }
    }
    local_250 = (void *)0x0;
    local_240 = 0;
    local_238 = 0;
    local_228 = 0;
    local_224 = 0;
    local_220 = 0;
    local_21c = 0;
    local_218 = 0;
    local_210 = 0;
    local_248 = (int *)0x0;
    local_100 = (long *)(in_RDI + 0x170);
    bVar3 = true;
    if (*local_100 != 0) {
      bVar3 = *(long *)(in_RDI + 0x1b0) * (long)*(int *)(in_RDI + 0x1a8) == 0;
      local_10 = local_100;
    }
    if (bVar3) {
      local_19c = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xd8) != 0) {
        (**(code **)(*local_1b0 + 0x10))(&local_298,local_1b0,*(undefined4 *)(in_RDI + 0xd8),1);
        ppvVar2 = (void **)(in_RDI + 0x1b8);
        local_160 = &local_298;
        local_158 = ppvVar2;
        if (ppvVar2 != local_160) {
          if (local_290 != (int *)0x0) {
            local_164 = 1;
            LOCK();
            local_168 = *local_290;
            *local_290 = *local_290 + 1;
            UNLOCK();
          }
          local_c8 = ppvVar2;
          if (*(long *)(in_RDI + 0x1c0) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1c0);
            local_cc = 0xffffffff;
            LOCK();
            local_d0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_d0 == 1) {
              if (*(long *)(in_RDI + 0x1d8) == 0) {
                local_30 = *ppvVar2;
                if (local_30 != (void *)0x0) {
                  free(local_30);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1d8) + 0x18))
                          (*(long **)(in_RDI + 0x1d8),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1c8) = 0;
          *(undefined4 *)(in_RDI + 0x1d0) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined4 *)(in_RDI + 0x1e4) = 0;
          *(undefined4 *)(in_RDI + 0x1e8) = 0;
          *(undefined4 *)(in_RDI + 0x1ec) = 0;
          *(undefined4 *)(in_RDI + 0x1f0) = 0;
          *(undefined8 *)(in_RDI + 0x1f8) = 0;
          *(undefined8 *)(in_RDI + 0x1c0) = 0;
          *ppvVar2 = *local_160;
          *(void **)(in_RDI + 0x1c0) = local_160[1];
          *(void **)(in_RDI + 0x1c8) = local_160[2];
          *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_160 + 3);
          *(void **)(in_RDI + 0x1d8) = local_160[4];
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_160 + 5);
          *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_160 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_160 + 6);
          *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_160 + 0x34);
          *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_160 + 7);
          *(void **)(in_RDI + 0x1f8) = local_160[8];
        }
        local_178 = &local_298;
        if (local_290 != (int *)0x0) {
          local_ac = 0xffffffff;
          LOCK();
          local_b0 = *local_290;
          *local_290 = *local_290 + -1;
          UNLOCK();
          if (local_b0 == 1) {
            local_150 = ppvVar2;
            local_a8 = local_178;
            if (local_278 == (long *)0x0) {
              if (local_298 != (void *)0x0) {
                free(local_298);
              }
            }
            else {
              (**(code **)(*local_278 + 0x18))(local_278,local_298);
            }
          }
        }
        bVar3 = true;
        if (*(long *)(in_RDI + 0x1b8) != 0) {
          bVar3 = *(long *)(in_RDI + 0x1f8) * (long)*(int *)(in_RDI + 0x1f0) == 0;
        }
        if (bVar3) {
          return -100;
        }
      }
      local_19c = 0;
    }
  }
  return local_19c;
}

Assistant:

int Requantize::load_model(const ModelBin& mb)
{
    scale_in_data = mb.load(scale_in_data_size, 1);
    if (scale_in_data.empty())
        return -100;

    scale_out_data = mb.load(scale_out_data_size, 1);
    if (scale_out_data.empty())
        return -100;

    if (bias_data_size)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}